

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

RPCHelpMan * wallet::getbalances(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff1e8;
  allocator<RPCResult> *paVar1;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff1f0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff218;
  RPCResult *in_stack_fffffffffffff220;
  RPCResult *in_stack_fffffffffffff228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff230;
  undefined7 in_stack_fffffffffffff238;
  undefined1 in_stack_fffffffffffff23f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff240;
  undefined7 in_stack_fffffffffffff248;
  undefined1 in_stack_fffffffffffff24f;
  undefined7 in_stack_fffffffffffff250;
  undefined1 in_stack_fffffffffffff257;
  string *in_stack_fffffffffffff258;
  undefined4 in_stack_fffffffffffff260;
  Type in_stack_fffffffffffff264;
  undefined4 in_stack_fffffffffffff268;
  Type in_stack_fffffffffffff26c;
  RPCResult *in_stack_fffffffffffff270;
  undefined1 *local_d80;
  undefined1 *local_d68;
  undefined1 *local_d50;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_b70 [35];
  allocator<char> local_b4d;
  allocator<char> local_b4c;
  allocator<char> local_b4b [3];
  pointer local_b48;
  pointer pRStack_b40;
  pointer local_b38;
  allocator<char> local_b2a;
  allocator<char> local_b29;
  _Alloc_hider local_b28;
  size_type sStack_b20;
  undefined1 local_b18 [15];
  allocator<char> local_b09;
  undefined1 local_b08 [30];
  undefined1 local_aea;
  vector<RPCArg,_std::allocator<RPCArg>_> local_ae9;
  undefined1 local_acb;
  undefined1 local_aca [33];
  allocator<char> local_aa9 [9];
  undefined8 uStack_aa0;
  undefined8 local_a98;
  allocator<char> local_a8a;
  allocator<char> local_a89;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  allocator<char> local_a6a;
  allocator<char> local_a69;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  allocator<char> local_a42;
  allocator<char> local_a41 [31];
  allocator<char> local_a22;
  allocator<char> local_a21 [31];
  allocator<char> local_a02;
  allocator<char> local_a01 [25];
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  allocator<char> local_9c1 [449];
  undefined1 local_800 [408];
  undefined1 local_668 [320];
  undefined1 local_528 [544];
  undefined1 local_308 [64];
  undefined1 local_2c8 [136];
  string local_240 [8];
  undefined1 local_130 [296];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                 in_stack_fffffffffffff230);
  std::operator+(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
  local_9e8 = 0;
  uStack_9e0 = 0;
  local_9d8 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(in_stack_fffffffffffff1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  local_a68 = 0;
  uStack_a60 = 0;
  local_a58 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1e8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff270,in_stack_fffffffffffff26c,
             (string *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             in_stack_fffffffffffff258,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
             (bool)in_stack_fffffffffffff24f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  local_a88 = 0;
  uStack_a80 = 0;
  local_a78 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1e8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff270,in_stack_fffffffffffff26c,
             (string *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             in_stack_fffffffffffff258,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
             (bool)in_stack_fffffffffffff24f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  local_aa9[1] = (allocator<char>)0x0;
  local_aa9[2] = (allocator<char>)0x0;
  local_aa9[3] = (allocator<char>)0x0;
  local_aa9[4] = (allocator<char>)0x0;
  local_aa9[5] = (allocator<char>)0x0;
  local_aa9[6] = (allocator<char>)0x0;
  local_aa9[7] = (allocator<char>)0x0;
  local_aa9[8] = (allocator<char>)0x0;
  uStack_aa0 = 0;
  local_a98 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1e8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff270,in_stack_fffffffffffff26c,
             (string *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             in_stack_fffffffffffff258,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
             (bool)in_stack_fffffffffffff24f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  local_aca._2_8_ = 0;
  local_aca._10_8_ = 0;
  local_aca._18_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1e8);
  paVar1 = (allocator<RPCResult> *)((ulong)in_stack_fffffffffffff1e8 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
             in_stack_fffffffffffff264,in_stack_fffffffffffff258,(bool)in_stack_fffffffffffff257,
             (string *)CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
             in_stack_fffffffffffff240,(bool)in_stack_fffffffffffff23f);
  fun = (RPCMethodImpl *)0x4;
  std::allocator<RPCResult>::allocator(paVar1);
  __l._M_len._0_7_ = in_stack_fffffffffffff238;
  __l._M_array = (iterator)in_stack_fffffffffffff230;
  __l._M_len._7_1_ = in_stack_fffffffffffff23f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff228,__l,
             (allocator_type *)in_stack_fffffffffffff220);
  RPCResult::RPCResult
            (in_stack_fffffffffffff270,in_stack_fffffffffffff26c,
             (string *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             in_stack_fffffffffffff258,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
             (bool)in_stack_fffffffffffff24f);
  name = local_240;
  this_00 = (RPCHelpMan *)local_aca;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  description = (string *)&local_acb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  args = &local_ae9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  results = (RPCResults *)&local_aea;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  local_b08._0_8_ = (pointer)0x0;
  local_b08._8_8_ = 0;
  local_b08._16_8_ = 0;
  examples = (RPCExamples *)local_b08;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            (in_stack_fffffffffffff270,in_stack_fffffffffffff26c,
             (string *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             in_stack_fffffffffffff258,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
             (bool)in_stack_fffffffffffff24f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  local_b28._M_p = (pointer)0x0;
  sStack_b20 = 0;
  local_b18._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            (in_stack_fffffffffffff270,in_stack_fffffffffffff26c,
             (string *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             in_stack_fffffffffffff258,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
             (bool)in_stack_fffffffffffff24f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  local_b48 = (pointer)0x0;
  pRStack_b40 = (pointer)0x0;
  local_b38 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            (in_stack_fffffffffffff270,in_stack_fffffffffffff26c,
             (string *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             in_stack_fffffffffffff258,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
             (bool)in_stack_fffffffffffff24f);
  std::allocator<RPCResult>::allocator(paVar1);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff238;
  __l_00._M_array = (iterator)in_stack_fffffffffffff230;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff23f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff228,__l_00,
             (allocator_type *)in_stack_fffffffffffff220);
  paVar1 = (allocator<RPCResult> *)((ulong)paVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
             in_stack_fffffffffffff264,in_stack_fffffffffffff258,(bool)in_stack_fffffffffffff257,
             (string *)CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
             in_stack_fffffffffffff240,(bool)in_stack_fffffffffffff23f);
  RPCResult::RPCResult(in_stack_fffffffffffff228,in_stack_fffffffffffff220);
  std::allocator<RPCResult>::allocator(paVar1);
  __l_01._M_len._0_7_ = in_stack_fffffffffffff238;
  __l_01._M_array = (iterator)in_stack_fffffffffffff230;
  __l_01._M_len._7_1_ = in_stack_fffffffffffff23f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff228,__l_01,
             (allocator_type *)in_stack_fffffffffffff220);
  RPCResult::RPCResult
            (in_stack_fffffffffffff270,in_stack_fffffffffffff26c,
             (string *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             in_stack_fffffffffffff258,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
             (bool)in_stack_fffffffffffff24f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  HelpExampleCli((string *)in_stack_fffffffffffff220,in_stack_fffffffffffff218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
             (char *)in_stack_fffffffffffff230,(allocator<char> *)in_stack_fffffffffffff228);
  HelpExampleRpc((string *)in_stack_fffffffffffff220,in_stack_fffffffffffff218);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218);
  RPCExamples::RPCExamples((RPCExamples *)paVar1,(string *)0xc5e409);
  this = (RPCResult *)local_b70;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::getbalances()::__0,void>(in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_b70 + 0x22));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_b4d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_b4c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_b4b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_d50 = local_130;
  do {
    local_d50 = local_d50 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_d50 != local_2c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_d68 = local_668;
  do {
    local_d68 = local_d68 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_d68 != local_800);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_b2a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_b29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_b18 + 0xe));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_b09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_aea);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_acb);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_aca);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_d80 = local_308;
  do {
    local_d80 = local_d80 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_d80 != local_528);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_aca + 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_aa9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_a8a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_a89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_a6a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_a69);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_a42);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_a41);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_a22);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_a21);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_a02);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_a01);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_9c1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getbalances()
{
    return RPCHelpMan{
        "getbalances",
        "Returns an object with all balances in " + CURRENCY_UNIT + ".\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::OBJ, "mine", "balances from outputs that the wallet can sign",
                {
                    {RPCResult::Type::STR_AMOUNT, "trusted", "trusted balance (outputs created by the wallet or confirmed outputs)"},
                    {RPCResult::Type::STR_AMOUNT, "untrusted_pending", "untrusted pending balance (outputs created by others that are in the mempool)"},
                    {RPCResult::Type::STR_AMOUNT, "immature", "balance from immature coinbase outputs"},
                    {RPCResult::Type::STR_AMOUNT, "used", /*optional=*/true, "(only present if avoid_reuse is set) balance from coins sent to addresses that were previously spent from (potentially privacy violating)"},
                }},
                {RPCResult::Type::OBJ, "watchonly", /*optional=*/true, "watchonly balances (not present if wallet does not watch anything)",
                {
                    {RPCResult::Type::STR_AMOUNT, "trusted", "trusted balance (outputs created by the wallet or confirmed outputs)"},
                    {RPCResult::Type::STR_AMOUNT, "untrusted_pending", "untrusted pending balance (outputs created by others that are in the mempool)"},
                    {RPCResult::Type::STR_AMOUNT, "immature", "balance from immature coinbase outputs"},
                }},
                RESULT_LAST_PROCESSED_BLOCK,
            }
            },
        RPCExamples{
            HelpExampleCli("getbalances", "") +
            HelpExampleRpc("getbalances", "")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> rpc_wallet = GetWalletForJSONRPCRequest(request);
    if (!rpc_wallet) return UniValue::VNULL;
    const CWallet& wallet = *rpc_wallet;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    LOCK(wallet.cs_wallet);

    const auto bal = GetBalance(wallet);
    UniValue balances{UniValue::VOBJ};
    {
        UniValue balances_mine{UniValue::VOBJ};
        balances_mine.pushKV("trusted", ValueFromAmount(bal.m_mine_trusted));
        balances_mine.pushKV("untrusted_pending", ValueFromAmount(bal.m_mine_untrusted_pending));
        balances_mine.pushKV("immature", ValueFromAmount(bal.m_mine_immature));
        if (wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE)) {
            // If the AVOID_REUSE flag is set, bal has been set to just the un-reused address balance. Get
            // the total balance, and then subtract bal to get the reused address balance.
            const auto full_bal = GetBalance(wallet, 0, false);
            balances_mine.pushKV("used", ValueFromAmount(full_bal.m_mine_trusted + full_bal.m_mine_untrusted_pending - bal.m_mine_trusted - bal.m_mine_untrusted_pending));
        }
        balances.pushKV("mine", std::move(balances_mine));
    }
    auto spk_man = wallet.GetLegacyScriptPubKeyMan();
    if (spk_man && spk_man->HaveWatchOnly()) {
        UniValue balances_watchonly{UniValue::VOBJ};
        balances_watchonly.pushKV("trusted", ValueFromAmount(bal.m_watchonly_trusted));
        balances_watchonly.pushKV("untrusted_pending", ValueFromAmount(bal.m_watchonly_untrusted_pending));
        balances_watchonly.pushKV("immature", ValueFromAmount(bal.m_watchonly_immature));
        balances.pushKV("watchonly", std::move(balances_watchonly));
    }

    AppendLastProcessedBlock(balances, wallet);
    return balances;
},
    };
}